

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

Node * prvTidyParseHead(TidyDocImpl *doc,Node *head,GetTokenMode mode)

{
  TidyTagId TVar1;
  TidyParserMemory *pTVar2;
  Lexer *pLVar3;
  Dict *pDVar4;
  TidyParserMemory data;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  NodeType NVar8;
  Bool BVar9;
  int iVar10;
  long lVar11;
  Node *node;
  Node *pNVar12;
  Node **ppNVar13;
  uint uVar14;
  uint uVar15;
  long lStack_40;
  
  uVar15 = 0;
  uVar14 = 0;
  if (head == (Node *)0x0) {
    iVar10 = (doc->stack).top;
    lVar11 = (long)iVar10;
    if (lVar11 < 0) {
      head = (Node *)0x0;
      uVar15 = 0;
      uVar14 = 0;
    }
    else {
      pTVar2 = (doc->stack).content;
      head = pTVar2[lVar11].original_node;
      uVar15 = pTVar2[lVar11].register_1;
      uVar14 = pTVar2[lVar11].register_2;
      (doc->stack).top = iVar10 + -1;
    }
  }
  pLVar3 = doc->lexer;
  node = prvTidyGetToken(doc,IgnoreWhitespace);
  do {
    if (node == (Node *)0x0) {
      return (Node *)0x0;
    }
    pDVar4 = node->tag;
    if (pDVar4 == head->tag) {
      NVar8 = node->type;
      if (NVar8 == EndTag) {
        prvTidyFreeNode(doc,node);
        head->closed = yes;
        return (Node *)0x0;
      }
LAB_0013a488:
      if (NVar8 != StartTag) goto LAB_0013a4b2;
LAB_0013a48d:
      prvTidyReport(doc,head,node,0x235);
      prvTidyFreeNode(doc,node);
    }
    else {
      if ((pDVar4 != (Dict *)0x0) && (pDVar4->id == TidyTag_HTML)) {
        NVar8 = node->type;
        goto LAB_0013a488;
      }
LAB_0013a4b2:
      BVar9 = prvTidynodeIsText(node);
      if (BVar9 != no) {
        if ((*(int *)((doc->config).value + 0x3b) != 0) || (*(int *)((doc->config).value + 6) == 1))
        goto LAB_0013a593;
LAB_0013a57e:
        prvTidyReport(doc,head,node,0x27e);
LAB_0013a593:
        prvTidyUngetToken(doc);
        return (Node *)0x0;
      }
      if ((node->type == ProcInsTag) &&
         ((node->element != (ctmbstr)0x0 &&
          (iVar10 = prvTidytmbstrcmp(node->element,"xml-stylesheet"), iVar10 == 0)))) {
        prvTidyReport(doc,head,node,0x27e);
        pNVar12 = prvTidyFindHTML(doc);
        prvTidyInsertNodeBeforeElement(pNVar12,node);
      }
      else {
        BVar9 = InsertMisc(head,node);
        if (BVar9 == no) {
          if (node->type != DocTypeTag) {
            if (node->tag != (Dict *)0x0) {
              if ((node->tag->model & 4) == 0) {
                if (pLVar3->isvoyager == no) goto LAB_0013a593;
                goto LAB_0013a57e;
              }
              BVar9 = prvTidynodeIsElement(node);
              if (BVar9 != no) {
                if (node->tag != (Dict *)0x0) {
                  TVar1 = node->tag->id;
                  if (TVar1 == TidyTag_BASE) {
                    uVar6 = uVar14 + 1;
                    uVar7 = uVar15;
                    uVar5 = uVar14;
                  }
                  else {
                    if (TVar1 != TidyTag_TITLE) goto LAB_0013a61c;
                    uVar6 = uVar14;
                    uVar7 = uVar15 + 1;
                    uVar5 = uVar15;
                  }
                  uVar15 = uVar7;
                  uVar14 = uVar6;
                  if (0 < (int)uVar5) {
                    prvTidyReport(doc,head,node,0x27f);
                  }
                }
LAB_0013a61c:
                node->parent = head;
                pNVar12 = head->last;
                ppNVar13 = &pNVar12->next;
                if (pNVar12 == (Node *)0x0) {
                  ppNVar13 = &head->content;
                }
                node->prev = pNVar12;
                *ppNVar13 = node;
                head->last = node;
                lStack_40 = (ulong)uVar15 << 0x20;
                data.original_node = head;
                data.identity = prvTidyParseHead;
                data.reentry_node = node;
                data.reentry_mode = IgnoreWhitespace;
                data.reentry_state = 0;
                data.mode = (undefined4)lStack_40;
                data.register_1 = lStack_40._4_4_;
                data.register_2 = uVar14;
                data._44_4_ = 0;
                prvTidypushMemory(doc,data);
                return node;
              }
            }
            goto LAB_0013a48d;
          }
          InsertDocType(doc,head,node);
        }
      }
    }
    node = prvTidyGetToken(doc,IgnoreWhitespace);
  } while( true );
}

Assistant:

Node* TY_(ParseHead)( TidyDocImpl* doc, Node *head, GetTokenMode ARG_UNUSED(mode) )
{
    Lexer* lexer = doc->lexer;
    Node *node;
    int HasTitle = 0;
    int HasBase = 0;
    DEBUG_LOG_COUNTERS;

    if ( head == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        head = memory.original_node;
        HasTitle = memory.register_1;
        HasBase = memory.register_2;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(head);
    }
    
    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        if (node->tag == head->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            head->closed = yes;
            break;
        }

        /* find and discard multiple <head> elements */
        /* find and discard <html> in <head> elements */
        if ((node->tag == head->tag || nodeIsHTML(node)) && node->type == StartTag)
        {
            TY_(Report)(doc, head, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)(doc, node);
            continue;
        }

        if (TY_(nodeIsText)(node))
        {
            /*\ Issue #132 - avoid warning for missing body tag,
             *  if configured to --omit-otpional-tags yes
             *  Issue #314 - and if --show-body-only
            \*/
            if (!cfgBool( doc, TidyOmitOptionalTags ) &&
                !showingBodyOnly(doc) )
            {
                TY_(Report)(doc, head, node, TAG_NOT_ALLOWED_IN);
            }
            TY_(UngetToken)( doc );
            break;
        }

        if (node->type == ProcInsTag && node->element &&
            TY_(tmbstrcmp)(node->element, "xml-stylesheet") == 0)
        {
            TY_(Report)(doc, head, node, TAG_NOT_ALLOWED_IN);
            TY_(InsertNodeBeforeElement)(TY_(FindHTML)(doc), node);
            continue;
        }

        /* deal with comments etc. */
        if (InsertMisc(head, node))
            continue;

        if (node->type == DocTypeTag)
        {
            InsertDocType(doc, head, node);
            continue;
        }

        /* discard unknown tags */
        if (node->tag == NULL)
        {
            TY_(Report)(doc, head, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /*
         if it doesn't belong in the head then
         treat as implicit end of head and deal
         with as part of the body
        */
        if (!(node->tag->model & CM_HEAD))
        {
            /* #545067 Implicit closing of head broken - warn only for XHTML input */
            if ( lexer->isvoyager )
                TY_(Report)(doc, head, node, TAG_NOT_ALLOWED_IN );
            TY_(UngetToken)( doc );
            break;
        }

        if (TY_(nodeIsElement)(node))
        {
            if ( nodeIsTITLE(node) )
            {
                ++HasTitle;

                if (HasTitle > 1)
                    TY_(Report)(doc, head, node,
                                     head ?
                                     TOO_MANY_ELEMENTS_IN : TOO_MANY_ELEMENTS);
            }
            else if ( nodeIsBASE(node) )
            {
                ++HasBase;

                if (HasBase > 1)
                    TY_(Report)(doc, head, node,
                                     head ?
                                     TOO_MANY_ELEMENTS_IN : TOO_MANY_ELEMENTS);
            }

            TY_(InsertNodeAtEnd)(head, node);

            {
                TidyParserMemory memory = {0};
                memory.identity = TY_(ParseHead);
                memory.original_node = head;
                memory.reentry_node = node;
                memory.register_1 = HasTitle;
                memory.register_2 = HasBase;
                TY_(pushMemory)( doc, memory );
                DEBUG_LOG_EXIT_WITH_NODE(node);
                return node;
            }
        }

        /* discard unexpected text nodes and end tags */
        TY_(Report)(doc, head, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node);
    }
    DEBUG_LOG_EXIT;
    return NULL;
}